

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

bool __thiscall
jsoncons::typed_array_visitor<std::vector<double,_std::allocator<double>_>_>::visit_uint64
          (typed_array_visitor<std::vector<double,_std::allocator<double>_>_> *this,uint64_t value,
          semantic_tag param_3,ser_context *param_4,error_code *param_5)

{
  undefined8 in_RSI;
  undefined1 auVar1 [16];
  value_type_conflict4 *in_stack_ffffffffffffffc8;
  
  auVar1._8_4_ = (int)((ulong)in_RSI >> 0x20);
  auVar1._0_8_ = in_RSI;
  auVar1._12_4_ = 0x45300000;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)
             ((auVar1._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)),
             in_stack_ffffffffffffffc8);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t value, 
            semantic_tag, 
            const ser_context&,
            std::error_code&) override
        {
            v_.push_back(static_cast<value_type>(value));
            JSONCONS_VISITOR_RETURN;
        }